

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O3

CURLHcode curl_easy_header(CURL *easy,char *name,size_t nameindex,uint type,int request,
                          curl_header **hout)

{
  Curl_llist *list;
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  CURLHcode CVar4;
  size_t sVar5;
  Curl_llist_node *n;
  void *pvVar6;
  Curl_llist_node *n_00;
  Curl_easy *data;
  int iVar7;
  ulong local_58;
  void *local_38;
  
  CVar4 = CURLHE_BAD_ARGUMENT;
  if ((((-2 < request) && (0xffffffe0 < type - 0x20)) && (easy != (CURL *)0x0)) &&
     ((name != (char *)0x0 && (hout != (curl_header **)0x0)))) {
    list = (Curl_llist *)((long)easy + 0x1278);
    sVar5 = Curl_llist_count(list);
    if (sVar5 == 0) {
      CVar4 = CURLHE_NOHEADERS;
    }
    else {
      CVar4 = CURLHE_NOREQUEST;
      if (request <= *(int *)((long)easy + 0xc70)) {
        iVar7 = *(int *)((long)easy + 0xc70);
        if (request != -1) {
          iVar7 = request;
        }
        n = Curl_llist_head(list);
        if (n != (Curl_llist_node *)0x0) {
          local_38 = (void *)0x0;
          local_58 = 0;
          n_00 = (Curl_llist_node *)0x0;
          do {
            pvVar6 = Curl_node_elem(n);
            iVar2 = curl_strequal(*(char **)((long)pvVar6 + 0x20),name);
            if (((iVar2 != 0) && ((*(byte *)((long)pvVar6 + 0x34) & type) != 0)) &&
               (*(int *)((long)pvVar6 + 0x30) == iVar7)) {
              local_58 = local_58 + 1;
              n_00 = n;
              local_38 = pvVar6;
            }
            n = Curl_node_next(n);
          } while (n != (Curl_llist_node *)0x0);
          if (local_58 != 0) {
            if (local_58 <= nameindex) {
              return CURLHE_BADINDEX;
            }
            if (local_58 - 1 == nameindex) {
              uVar3 = (uint)*(byte *)((long)local_38 + 0x34);
LAB_00130dd2:
              uVar1 = *(undefined8 *)((long)local_38 + 0x28);
              *(undefined8 *)((long)easy + 0x1298) = *(undefined8 *)((long)local_38 + 0x20);
              *(undefined8 *)((long)easy + 0x12a0) = uVar1;
              *(ulong *)((long)easy + 0x12a8) = local_58;
              *(size_t *)((long)easy + 0x12b0) = nameindex;
              *(uint *)((long)easy + 0x12b8) = uVar3 | 0x8000000;
              *(Curl_llist_node **)((long)easy + 0x12c0) = n_00;
              *hout = (curl_header *)((long)easy + 0x1298);
              return CURLHE_OK;
            }
            n_00 = Curl_llist_head(list);
            if (n_00 != (Curl_llist_node *)0x0) {
              sVar5 = 0;
              do {
                local_38 = Curl_node_elem(n_00);
                iVar2 = curl_strequal(*(char **)((long)local_38 + 0x20),name);
                if (((iVar2 != 0) &&
                    (uVar3 = (uint)*(byte *)((long)local_38 + 0x34), (uVar3 & type) != 0)) &&
                   (*(int *)((long)local_38 + 0x30) == iVar7)) {
                  if (sVar5 == nameindex) goto LAB_00130dd2;
                  sVar5 = sVar5 + 1;
                }
                n_00 = Curl_node_next(n_00);
              } while (n_00 != (Curl_llist_node *)0x0);
            }
          }
        }
        CVar4 = CURLHE_MISSING;
      }
    }
  }
  return CVar4;
}

Assistant:

CURLHcode curl_easy_header(CURL *easy,
                           const char *name,
                           size_t nameindex,
                           unsigned int type,
                           int request,
                           struct curl_header **hout)
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *e_pick = NULL;
  struct Curl_easy *data = easy;
  size_t match = 0;
  size_t amount = 0;
  struct Curl_header_store *hs = NULL;
  struct Curl_header_store *pick = NULL;
  if(!name || !hout || !data ||
     (type > (CURLH_HEADER|CURLH_TRAILER|CURLH_CONNECT|CURLH_1XX|
              CURLH_PSEUDO)) || !type || (request < -1))
    return CURLHE_BAD_ARGUMENT;
  if(!Curl_llist_count(&data->state.httphdrs))
    return CURLHE_NOHEADERS; /* no headers available */
  if(request > data->state.requests)
    return CURLHE_NOREQUEST;
  if(request == -1)
    request = data->state.requests;

  /* we need a first round to count amount of this header */
  for(e = Curl_llist_head(&data->state.httphdrs); e; e = Curl_node_next(e)) {
    hs = Curl_node_elem(e);
    if(strcasecompare(hs->name, name) &&
       (hs->type & type) &&
       (hs->request == request)) {
      amount++;
      pick = hs;
      e_pick = e;
    }
  }
  if(!amount)
    return CURLHE_MISSING;
  else if(nameindex >= amount)
    return CURLHE_BADINDEX;

  if(nameindex == amount - 1)
    /* if the last or only occurrence is what's asked for, then we know it */
    hs = pick;
  else {
    for(e = Curl_llist_head(&data->state.httphdrs); e; e = Curl_node_next(e)) {
      hs = Curl_node_elem(e);
      if(strcasecompare(hs->name, name) &&
         (hs->type & type) &&
         (hs->request == request) &&
         (match++ == nameindex)) {
        e_pick = e;
        break;
      }
    }
    if(!e) /* this should not happen */
      return CURLHE_MISSING;
  }
  /* this is the name we want */
  copy_header_external(hs, nameindex, amount, e_pick,
                       &data->state.headerout[0]);
  *hout = &data->state.headerout[0];
  return CURLHE_OK;
}